

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O3

void __thiscall CRegexParser::CRegexParser(CRegexParser *this)

{
  this->tuple_arr_ = (re_tuple_conflict *)0x0;
  this->tuples_alloc_ = 0;
  this->next_state_ = 0;
  this->range_buf_ = (wchar_t *)0x0;
  this->range_buf_cnt_ = 0;
  this->range_buf_max_ = 0;
  return;
}

Assistant:

CRegexParser::CRegexParser()
{
    /* no tuple array yet */
    tuple_arr_ = 0;
    tuples_alloc_ = 0;

    /* clear states */
    next_state_ = RE_STATE_FIRST_VALID;

    /* no range buffer yet */
    range_buf_ = 0;
    range_buf_cnt_ = 0;
    range_buf_max_ = 0;
}